

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall fasttext::Dictionary::load(Dictionary *this,istream *in)

{
  undefined4 uVar1;
  reference pvVar2;
  char *in_RSI;
  vector<fasttext::entry,_std::allocator<fasttext::entry>_> *in_RDI;
  entry e;
  char c;
  int32_t i_1;
  int32_t i;
  entry *in_stack_fffffffffffffee0;
  int32_t in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef8;
  Dictionary *in_stack_ffffffffffffff00;
  undefined1 local_f8 [32];
  undefined1 local_d8 [8];
  undefined1 local_d0 [96];
  Dictionary *in_stack_ffffffffffffff90;
  int local_18;
  int local_14;
  
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::clear
            ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)0x147dfd);
  for (local_14 = 0; local_14 < 30000000; local_14 = local_14 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &(in_RDI->
                         super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>).
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_14);
    *pvVar2 = -1;
  }
  std::istream::read(in_RSI,(long)&in_RDI[5].
                                   super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::istream::read(in_RSI,(long)((long)&in_RDI[6].
                                          super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 4));
  std::istream::read(in_RSI,(long)&in_RDI[6].
                                   super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
  std::istream::read(in_RSI,(long)&in_RDI[6].
                                   super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  for (local_18 = 0;
      local_18 <
      *(int *)&in_RDI[5].super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage; local_18 = local_18 + 1) {
    entry::entry(in_stack_fffffffffffffee0);
    while( true ) {
      uVar1 = std::istream::get();
      if ((char)uVar1 == '\0') break;
      std::__cxx11::string::push_back((char)local_f8);
    }
    std::istream::read(in_RSI,(long)local_d8);
    std::istream::read(in_RSI,(long)local_d0);
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::push_back
              (in_RDI,(value_type *)CONCAT44(uVar1,in_stack_fffffffffffffee8));
    in_stack_fffffffffffffee0 =
         (entry *)&(in_RDI->super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    in_stack_fffffffffffffee8 = find(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee0,
                        (long)in_stack_fffffffffffffee8);
    *pvVar2 = local_18;
    entry::~entry(in_stack_fffffffffffffee0);
  }
  initTableDiscard(in_stack_ffffffffffffff00);
  initNgrams(in_stack_ffffffffffffff90);
  return;
}

Assistant:

void Dictionary::load(std::istream& in) {
  words_.clear();
  for (int32_t i = 0; i < MAX_VOCAB_SIZE; i++) {
    word2int_[i] = -1;
  }
  in.read((char*) &size_, sizeof(int32_t));
  in.read((char*) &nwords_, sizeof(int32_t));
  in.read((char*) &nlabels_, sizeof(int32_t));
  in.read((char*) &ntokens_, sizeof(int64_t));
  for (int32_t i = 0; i < size_; i++) {
    char c;
    entry e;
    while ((c = in.get()) != 0) {
      e.word.push_back(c);
    }
    in.read((char*) &e.count, sizeof(int64_t));
    in.read((char*) &e.type, sizeof(entry_type));
    words_.push_back(e);
    word2int_[find(e.word)] = i;
  }
  initTableDiscard();
  initNgrams();
}